

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3ExprAssignVarNumber(Parse *pParse,Expr *pExpr,u32 n)

{
  sqlite3 *db;
  char *zName;
  uint uVar1;
  int iVar2;
  int *piVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  short sVar8;
  ulong uVar9;
  VList *pIn;
  bool bVar10;
  ulong local_38;
  u32 uVar7;
  
  if (pExpr == (Expr *)0x0) {
    return;
  }
  db = pParse->db;
  zName = (pExpr->u).zToken;
  if ((long)zName[1] == 0) {
    uVar1 = *(int *)&pParse->nVar + 1;
    local_38 = (ulong)uVar1;
    pParse->nVar = (ynVar)uVar1;
    goto LAB_0014d1c5;
  }
  if (*zName == '?') {
    if (n == 2) {
      local_38 = (long)zName[1] - 0x30;
      bVar10 = false;
    }
    else {
      iVar5 = sqlite3Atoi64(zName + 1,(i64 *)&local_38,n - 1,'\x01');
      bVar10 = iVar5 != 0;
    }
    if (((bVar10) || ((long)local_38 < 1)) || ((long)db->aLimit[9] < (long)local_38)) {
      sqlite3ErrorMsg(pParse,"variable number must be between ?1 and ?%d");
      return;
    }
    sVar8 = (short)local_38;
    uVar9 = local_38;
    if (pParse->nVar < sVar8) {
      pParse->nVar = sVar8;
      pIn = pParse->pVList;
    }
    else {
      pIn = pParse->pVList;
      if (pIn == (int *)0x0) {
        pIn = (int *)0x0;
      }
      else {
        iVar5 = 2;
        do {
          piVar3 = pIn + iVar5;
          if (*piVar3 == (int)sVar8) {
            if (piVar3 != (int *)0xfffffffffffffff8) goto LAB_0014d1c5;
            break;
          }
          iVar5 = iVar5 + piVar3[1];
        } while (iVar5 < pIn[1]);
      }
    }
  }
  else {
    pIn = pParse->pVList;
    uVar1 = sqlite3VListNameToNum(pIn,zName,n);
    local_38 = (ulong)uVar1;
    if ((short)uVar1 != 0) goto LAB_0014d1c5;
    uVar1 = *(int *)&pParse->nVar + 1;
    pParse->nVar = (ynVar)uVar1;
    uVar9 = (ulong)uVar1;
  }
  uVar7 = n + 3;
  if (-1 < (int)n) {
    uVar7 = n;
  }
  iVar6 = (int)uVar7 >> 2;
  iVar5 = iVar6 + 3;
  if (pIn == (int *)0x0) {
    piVar3 = (int *)sqlite3DbMallocRawNN(db,(long)iVar6 * 4 + 0x34);
    if (piVar3 != (int *)0x0) {
      iVar6 = iVar6 + 0xd;
      piVar3[1] = 2;
      iVar4 = 2;
LAB_0014d179:
      *piVar3 = iVar6;
      iVar2 = iVar4 + iVar5;
      pIn = piVar3;
      goto LAB_0014d185;
    }
    pIn = (int *)0x0;
  }
  else {
    iVar4 = pIn[1];
    iVar2 = iVar4 + iVar5;
    if (*pIn < iVar2) {
      iVar6 = iVar5 + *pIn * 2;
      if (((pIn < (db->lookaside).pStart) || ((db->lookaside).pEnd <= pIn)) ||
         ((ulong)(db->lookaside).sz < (ulong)((long)iVar6 * 4))) {
        piVar3 = (int *)dbReallocFinish(db,pIn,(long)iVar6 * 4);
        if (piVar3 != (int *)0x0) {
          iVar4 = piVar3[1];
          goto LAB_0014d179;
        }
        goto LAB_0014d1b9;
      }
      *pIn = iVar6;
    }
LAB_0014d185:
    piVar3 = pIn + iVar4;
    *piVar3 = (int)(short)uVar9;
    piVar3[1] = iVar5;
    pIn[1] = iVar2;
    memcpy(piVar3 + 2,zName,(long)(int)n);
    *(undefined1 *)((long)pIn + (long)(int)n + 8U + (long)iVar4 * 4) = 0;
  }
LAB_0014d1b9:
  pParse->pVList = pIn;
  local_38 = uVar9;
LAB_0014d1c5:
  pExpr->iColumn = (short)local_38;
  if ((int)(short)local_38 <= db->aLimit[9]) {
    return;
  }
  sqlite3ErrorMsg(pParse,"too many SQL variables");
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprAssignVarNumber(Parse *pParse, Expr *pExpr, u32 n){
  sqlite3 *db = pParse->db;
  const char *z;
  ynVar x;

  if( pExpr==0 ) return;
  assert( !ExprHasProperty(pExpr, EP_IntValue|EP_Reduced|EP_TokenOnly) );
  z = pExpr->u.zToken;
  assert( z!=0 );
  assert( z[0]!=0 );
  assert( n==(u32)sqlite3Strlen30(z) );
  if( z[1]==0 ){
    /* Wildcard of the form "?".  Assign the next variable number */
    assert( z[0]=='?' );
    x = (ynVar)(++pParse->nVar);
  }else{
    int doAdd = 0;
    if( z[0]=='?' ){
      /* Wildcard of the form "?nnn".  Convert "nnn" to an integer and
      ** use it as the variable number */
      i64 i;
      int bOk;
      if( n==2 ){ /*OPTIMIZATION-IF-TRUE*/
        i = z[1]-'0';  /* The common case of ?N for a single digit N */
        bOk = 1;
      }else{
        bOk = 0==sqlite3Atoi64(&z[1], &i, n-1, SQLITE_UTF8);
      }
      testcase( i==0 );
      testcase( i==1 );
      testcase( i==db->aLimit[SQLITE_LIMIT_VARIABLE_NUMBER]-1 );
      testcase( i==db->aLimit[SQLITE_LIMIT_VARIABLE_NUMBER] );
      if( bOk==0 || i<1 || i>db->aLimit[SQLITE_LIMIT_VARIABLE_NUMBER] ){
        sqlite3ErrorMsg(pParse, "variable number must be between ?1 and ?%d",
            db->aLimit[SQLITE_LIMIT_VARIABLE_NUMBER]);
        return;
      }
      x = (ynVar)i;
      if( x>pParse->nVar ){
        pParse->nVar = (int)x;
        doAdd = 1;
      }else if( sqlite3VListNumToName(pParse->pVList, x)==0 ){
        doAdd = 1;
      }
    }else{
      /* Wildcards like ":aaa", "$aaa" or "@aaa".  Reuse the same variable
      ** number as the prior appearance of the same name, or if the name
      ** has never appeared before, reuse the same variable number
      */
      x = (ynVar)sqlite3VListNameToNum(pParse->pVList, z, n);
      if( x==0 ){
        x = (ynVar)(++pParse->nVar);
        doAdd = 1;
      }
    }
    if( doAdd ){
      pParse->pVList = sqlite3VListAdd(db, pParse->pVList, z, n, x);
    }
  }
  pExpr->iColumn = x;
  if( x>db->aLimit[SQLITE_LIMIT_VARIABLE_NUMBER] ){
    sqlite3ErrorMsg(pParse, "too many SQL variables");
  }
}